

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

int lua_setmetatable(lua_State *L,int objindex)

{
  int iVar1;
  global_State *pgVar2;
  GCObject *pGVar3;
  GCObject *extraout_RAX;
  GCObject *v;
  
  pGVar3 = (GCObject *)index2adr(L,objindex);
  if (L->top[-1].tt == 0) {
    v = (GCObject *)0x0;
  }
  else {
    v = L->top[-1].value.gc;
  }
  iVar1 = *(int *)&(pGVar3->gch).tt;
  if ((long)iVar1 == 7) {
    *(GCObject **)((long)(pGVar3->gch).next + 0x10) = v;
    if (((v != (GCObject *)0x0) && (((v->gch).marked & 3) != 0)) &&
       (((((pGVar3->gch).next)->gch).marked & 4) != 0)) {
      luaC_barrierf(L,(pGVar3->gch).next,v);
      pGVar3 = extraout_RAX;
    }
  }
  else if (iVar1 == 5) {
    *(GCObject **)((long)&((pGVar3->gch).next)->h + 0x10) = v;
    if ((v != (GCObject *)0x0) && (((v->gch).marked & 3) != 0)) {
      pGVar3 = (pGVar3->gch).next;
      if (((pGVar3->gch).marked & 4) != 0) {
        pgVar2 = L->l_G;
        (pGVar3->gch).marked = (pGVar3->gch).marked & 0xfb;
        ((TValue *)&(pGVar3->h).gclist)->value = (Value)pgVar2->grayagain;
        pgVar2->grayagain = pGVar3;
      }
    }
  }
  else {
    pGVar3 = (GCObject *)L->l_G;
    *(GCObject **)((long)pGVar3 + (long)iVar1 * 8 + 0xe0) = v;
  }
  L->top = L->top + -1;
  return (int)pGVar3;
}

Assistant:

static int lua_setmetatable(lua_State*L,int objindex){
TValue*obj;
Table*mt;
api_checknelems(L,1);
obj=index2adr(L,objindex);
api_checkvalidindex(L,obj);
if(ttisnil(L->top-1))
mt=NULL;
else{
luai_apicheck(L,ttistable(L->top-1));
mt=hvalue(L->top-1);
}
switch(ttype(obj)){
case 5:{
hvalue(obj)->metatable=mt;
if(mt)
luaC_objbarriert(L,hvalue(obj),mt);
break;
}
case 7:{
uvalue(obj)->metatable=mt;
if(mt)
luaC_objbarrier(L,rawuvalue(obj),mt);
break;
}
default:{
G(L)->mt[ttype(obj)]=mt;
break;
}
}
L->top--;
return 1;
}